

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O2

void __thiscall
CVmImagePool::vmpbs_load_page
          (CVmImagePool *this,pool_ofs_t ofs,size_t param_2,size_t load_size,char *mem)

{
  CVmImagePool_pg *pCVar1;
  undefined1 auVar2 [16];
  
  auVar2._8_8_ = 0;
  auVar2._0_8_ = this->page_size_;
  pCVar1 = this->page_info_[SUB168(ZEXT416(ofs) / auVar2,0) >> 0xc];
  seek_page_ofs(this,ofs);
  (*this->fp_->_vptr_CVmImageFile[3])(this->fp_,mem,load_size);
  apply_xor_mask(mem,load_size,pCVar1[SUB164(ZEXT416(ofs) / auVar2,0) & 0xfff].xor_mask);
  return;
}

Assistant:

void CVmImagePool::vmpbs_load_page(pool_ofs_t ofs, size_t /*page_size*/,
                                   size_t load_size, char *mem)
{
    CVmImagePool_pg *info;

    /* get the page information */
    info = get_page_info_ofs(ofs);

    /* seek to the correct location in the image file */
    seek_page_ofs(ofs);

    /* ask the underlying file to load the data */
    fp_->copy_data(mem, load_size);

    /* apply the XOR mask to the loaded data */
    apply_xor_mask(mem, load_size, info->xor_mask);
}